

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O0

void psh_glyph_find_strong_points(PSH_Glyph glyph,FT_Int dimension)

{
  FT_UInt count_00;
  PS_Mask pPVar1;
  PSH_Point_conflict pPVar2;
  FT_Int major_dir_00;
  PSH_Hint_Table table_00;
  FT_Long FVar3;
  uint local_88;
  FT_UInt local_84;
  PSH_Point_conflict local_80;
  PSH_Point_conflict point_2;
  FT_UInt count_2;
  PSH_Point_conflict point_1;
  FT_UInt count_1;
  PSH_Point_conflict point;
  FT_UInt count;
  FT_UInt next;
  FT_Int threshold;
  FT_Fixed scale;
  PSH_Dimension dim;
  FT_UInt local_30;
  FT_Int major_dir;
  FT_UInt first;
  FT_UInt num_masks;
  PS_Mask mask;
  PSH_Hint_Table table;
  FT_Int dimension_local;
  PSH_Glyph glyph_local;
  
  table_00 = glyph->hint_tables + dimension;
  pPVar1 = table_00->hint_masks->masks;
  major_dir = table_00->hint_masks->num_masks;
  major_dir_00 = 2;
  if (dimension == 0) {
    major_dir_00 = 1;
  }
  FVar3 = FT_DivFix(0x20,glyph->globals->dimension[dimension].scale_mult);
  count = (FT_UInt)FVar3;
  if (0x1e < (int)count) {
    count = 0x1e;
  }
  if ((1 < (uint)major_dir) && (glyph->num_points != 0)) {
    if (glyph->num_points < pPVar1->end_point) {
      local_84 = glyph->num_points;
    }
    else {
      local_84 = pPVar1->end_point;
    }
    local_30 = local_84;
    for (; _first = pPVar1 + 1, 1 < (uint)major_dir; major_dir = major_dir + -1) {
      if (pPVar1[1].end_point < glyph->num_points) {
        local_88 = pPVar1[1].end_point;
      }
      else {
        local_88 = glyph->num_points;
      }
      if (local_30 < local_88) {
        pPVar2 = glyph->points;
        psh_hint_table_activate_mask(table_00,_first);
        psh_hint_table_find_strong_points
                  (table_00,pPVar2 + local_30,local_88 - local_30,count,major_dir_00);
      }
      local_30 = local_88;
      pPVar1 = _first;
    }
  }
  if (major_dir == 1) {
    count_00 = glyph->num_points;
    pPVar2 = glyph->points;
    psh_hint_table_activate_mask(table_00,table_00->hint_masks->masks);
    psh_hint_table_find_strong_points(table_00,pPVar2,count_00,count,major_dir_00);
  }
  local_80 = glyph->points;
  for (point_2._4_4_ = glyph->num_points; point_2._4_4_ != 0; point_2._4_4_ = point_2._4_4_ - 1) {
    if ((local_80->hint != (PSH_Hint_conflict)0x0) && ((local_80->flags2 & 0x10) == 0)) {
      local_80->flags2 = local_80->flags2 | 0x10;
    }
    local_80 = local_80 + 1;
  }
  return;
}

Assistant:

static void
  psh_glyph_find_strong_points( PSH_Glyph  glyph,
                                FT_Int     dimension )
  {
    /* a point is `strong' if it is located on a stem edge and       */
    /* has an `in' or `out' tangent parallel to the hint's direction */

    PSH_Hint_Table  table     = &glyph->hint_tables[dimension];
    PS_Mask         mask      = table->hint_masks->masks;
    FT_UInt         num_masks = table->hint_masks->num_masks;
    FT_UInt         first     = 0;
    FT_Int          major_dir = ( dimension == 0 ) ? PSH_DIR_VERTICAL
                                                   : PSH_DIR_HORIZONTAL;
    PSH_Dimension   dim       = &glyph->globals->dimension[dimension];
    FT_Fixed        scale     = dim->scale_mult;
    FT_Int          threshold;


    threshold = (FT_Int)FT_DivFix( PSH_STRONG_THRESHOLD, scale );
    if ( threshold > PSH_STRONG_THRESHOLD_MAXIMUM )
      threshold = PSH_STRONG_THRESHOLD_MAXIMUM;

    /* process secondary hints to `selected' points */
    if ( num_masks > 1 && glyph->num_points > 0 )
    {
      /* the `endchar' op can reduce the number of points */
      first = mask->end_point > glyph->num_points
                ? glyph->num_points
                : mask->end_point;
      mask++;
      for ( ; num_masks > 1; num_masks--, mask++ )
      {
        FT_UInt  next = FT_MIN( mask->end_point, glyph->num_points );


        if ( next > first )
        {
          FT_UInt    count = next - first;
          PSH_Point  point = glyph->points + first;


          psh_hint_table_activate_mask( table, mask );

          psh_hint_table_find_strong_points( table, point, count,
                                             threshold, major_dir );
        }
        first = next;
      }
    }

    /* process primary hints for all points */
    if ( num_masks == 1 )
    {
      FT_UInt    count = glyph->num_points;
      PSH_Point  point = glyph->points;


      psh_hint_table_activate_mask( table, table->hint_masks->masks );

      psh_hint_table_find_strong_points( table, point, count,
                                         threshold, major_dir );
    }

    /* now, certain points may have been attached to a hint and */
    /* not marked as strong; update their flags then            */
    {
      FT_UInt    count = glyph->num_points;
      PSH_Point  point = glyph->points;


      for ( ; count > 0; count--, point++ )
        if ( point->hint && !psh_point_is_strong( point ) )
          psh_point_set_strong( point );
    }
  }